

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

TokenKind slang::syntax::SyntaxFacts::getSkipToKind(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  switch(CONCAT22(in_register_0000003a,kind)) {
  case 0x78:
    return EndCheckerKeyword;
  case 0x79:
    return EndClassKeyword;
  case 0x7a:
    return EndClockingKeyword;
  case 0x7b:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
    goto switchD_001fb3b8_caseD_e9;
  case 0x7c:
    return EndConfigKeyword;
  case 0x82:
    return EndGroupKeyword;
  default:
    switch(CONCAT22(in_register_0000003a,kind)) {
    case 0xc:
    case 0xd:
      return CloseBrace;
    case 0xe:
    case 0x10:
      break;
    case 0xf:
      return CloseBracket;
    case 0x11:
      return CloseParenthesis;
    default:
      switch(CONCAT22(in_register_0000003a,kind)) {
      case 0xe8:
        return EndPackageKeyword;
      case 0xe9:
      case 0xea:
      case 0xeb:
      case 0xec:
      case 0xee:
        break;
      case 0xed:
        return EndPrimitiveKeyword;
      case 0xef:
        return EndProgramKeyword;
      case 0xf0:
        return EndPropertyKeyword;
      default:
        if (CONCAT22(in_register_0000003a,kind) == 0x69) {
          return EndKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0x73) {
          return EndCaseKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0xae) {
          return JoinKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0xb0) {
          return EndFunctionKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0xb1) {
          return EndGenerateKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 200) {
          return EndInterfaceKeyword;
        }
        if ((CONCAT22(in_register_0000003a,kind) == 0xd5) ||
           (CONCAT22(in_register_0000003a,kind) == 0xd9)) {
          return EndModuleKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0x112) {
          return EndSequenceKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0x11a) {
          return EndSpecifyKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0x127) {
          return EndTableKeyword;
        }
        if (CONCAT22(in_register_0000003a,kind) == 0x129) {
          return EndTaskKeyword;
        }
      }
    }
switchD_001fb3b8_caseD_e9:
    return Unknown;
  }
}

Assistant:

parsing::TokenKind SyntaxFacts::getSkipToKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis: return TokenKind::CloseParenthesis;
        case TokenKind::OpenBrace: return TokenKind::CloseBrace;
        case TokenKind::OpenBracket: return TokenKind::CloseBracket;
        case TokenKind::ApostropheOpenBrace: return TokenKind::CloseBrace;
        case TokenKind::BeginKeyword: return TokenKind::EndKeyword;
        case TokenKind::CaseKeyword: return TokenKind::EndCaseKeyword;
        case TokenKind::CheckerKeyword: return TokenKind::EndCheckerKeyword;
        case TokenKind::ClassKeyword: return TokenKind::EndClassKeyword;
        case TokenKind::ClockingKeyword: return TokenKind::EndClockingKeyword;
        case TokenKind::ConfigKeyword: return TokenKind::EndConfigKeyword;
        case TokenKind::ForkKeyword: return TokenKind::JoinKeyword;
        case TokenKind::FunctionKeyword: return TokenKind::EndFunctionKeyword;
        case TokenKind::GenerateKeyword: return TokenKind::EndGenerateKeyword;
        case TokenKind::CoverGroupKeyword: return TokenKind::EndGroupKeyword;
        case TokenKind::InterfaceKeyword: return TokenKind::EndInterfaceKeyword;
        case TokenKind::ModuleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::MacromoduleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::PackageKeyword: return TokenKind::EndPackageKeyword;
        case TokenKind::PrimitiveKeyword: return TokenKind::EndPrimitiveKeyword;
        case TokenKind::ProgramKeyword: return TokenKind::EndProgramKeyword;
        case TokenKind::PropertyKeyword: return TokenKind::EndPropertyKeyword;
        case TokenKind::SpecifyKeyword: return TokenKind::EndSpecifyKeyword;
        case TokenKind::SequenceKeyword: return TokenKind::EndSequenceKeyword;
        case TokenKind::TableKeyword: return TokenKind::EndTableKeyword;
        case TokenKind::TaskKeyword: return TokenKind::EndTaskKeyword;
        default:
            return TokenKind::Unknown;
    }
}